

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::ConvolutionLayerParams::MergePartialFromCodedStream
          (ConvolutionLayerParams *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  ValidPadding *value;
  SamePadding *value_00;
  WeightParams *pWVar5;
  RepeatedField<unsigned_long> *pRVar6;
  bool local_8a;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  ConvolutionLayerParams *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  do {
    kMax1ByteVarint = 0x3fff;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if (input->buffer_ < input->buffer_end_) {
      tag_2 = (uint32)*input->buffer_;
      if ((char)*input->buffer_ < '\x01') {
        if ((input->buffer_end_ <= input->buffer_ + 1) ||
           ((*input->buffer_ & (input->buffer_[1] ^ 0xff)) < 0x80)) goto LAB_00290bba;
        uStack_30 = 0x3fff;
        tag_1 = (uint)input->buffer_[1] * 0x80 + (*input->buffer_ - 0x80);
        google::protobuf::io::CodedInputStream::Advance(input,2);
        local_8a = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
        local_35 = local_8a;
        pVar4 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*input->buffer_;
        google::protobuf::io::CodedInputStream::Advance(input,1);
        local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_89;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
    }
    else {
LAB_00290bba:
      local_3c = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) {
LAB_002910d3:
      if ((tag_00 == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
    }
    else {
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      switch(iVar2) {
      case 1:
        if ((tag_00 & 0xff) != 8) goto LAB_002910d3;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,&this->outputchannels_);
        break;
      case 2:
        if ((tag_00 & 0xff) != 0x10) goto LAB_002910d3;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,&this->kernelchannels_);
        break;
      default:
        goto LAB_002910d3;
      case 10:
        if ((tag_00 & 0xff) != 0x50) goto LAB_002910d3;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,&this->ngroups_);
        break;
      case 0x14:
        if ((tag_00 & 0xff) == 0xa2) {
          pRVar6 = mutable_kernelsize(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (input,pRVar6);
        }
        else {
          if ((tag_00 & 0xff) != 0xa0) goto LAB_002910d3;
          pRVar6 = mutable_kernelsize(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitiveNoInline<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (2,0xa2,input,pRVar6);
        }
        break;
      case 0x1e:
        if ((tag_00 & 0xff) == 0xf2) {
          pRVar6 = mutable_stride(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (input,pRVar6);
        }
        else {
          if ((tag_00 & 0xff) != 0xf0) goto LAB_002910d3;
          pRVar6 = mutable_stride(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitiveNoInline<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (2,0xf2,input,pRVar6);
        }
        break;
      case 0x28:
        if ((tag_00 & 0xff) == 0x42) {
          pRVar6 = mutable_dilationfactor(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (input,pRVar6);
        }
        else {
          if ((tag_00 & 0xff) != 0x40) goto LAB_002910d3;
          pRVar6 = mutable_dilationfactor(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitiveNoInline<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (2,0x142,input,pRVar6);
        }
        break;
      case 0x32:
        if ((tag_00 & 0xff) != 0x92) goto LAB_002910d3;
        value = mutable_valid(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::ValidPadding>(input,value);
        break;
      case 0x33:
        if ((tag_00 & 0xff) != 0x9a) goto LAB_002910d3;
        value_00 = mutable_same(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::SamePadding>(input,value_00);
        break;
      case 0x3c:
        if ((tag_00 & 0xff) != 0xe0) goto LAB_002910d3;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->isdeconvolution_);
        break;
      case 0x46:
        if ((tag_00 & 0xff) != 0x30) goto LAB_002910d3;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->hasbias_);
        break;
      case 0x5a:
        if ((tag_00 & 0xff) != 0xd2) goto LAB_002910d3;
        pWVar5 = mutable_weights(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::WeightParams>(input,pWVar5);
        break;
      case 0x5b:
        if ((tag_00 & 0xff) != 0xda) goto LAB_002910d3;
        pWVar5 = mutable_bias(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::WeightParams>(input,pWVar5);
        break;
      case 100:
        if ((tag_00 & 0xff) == 0x22) {
          pRVar6 = mutable_outputshape(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (input,pRVar6);
        }
        else {
          if ((tag_00 & 0xff) != 0x20) goto LAB_002910d3;
          pRVar6 = mutable_outputshape(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitiveNoInline<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                            (2,0x322,input,pRVar6);
        }
      }
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool ConvolutionLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ConvolutionLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 outputChannels = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputchannels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 kernelChannels = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &kernelchannels_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 nGroups = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &ngroups_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 kernelSize = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_kernelsize())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(160u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 162u, input, this->mutable_kernelsize())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 stride = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_stride())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(240u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 242u, input, this->mutable_stride())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 dilationFactor = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_dilationfactor())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(320u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 322u, input, this->mutable_dilationfactor())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.ValidPadding valid = 50;
      case 50: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(402u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_valid()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.SamePadding same = 51;
      case 51: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(410u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_same()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool isDeconvolution = 60;
      case 60: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(480u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &isdeconvolution_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool hasBias = 70;
      case 70: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(560u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &hasbias_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams weights = 90;
      case 90: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(722u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams bias = 91;
      case 91: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(730u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 outputShape = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_outputshape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(800u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 2, 802u, input, this->mutable_outputshape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ConvolutionLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ConvolutionLayerParams)
  return false;
#undef DO_
}